

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_exprs)

{
  int iVar1;
  undefined8 uVar2;
  size_type __new_size;
  int in_ESI;
  long in_RDI;
  value_type *__x;
  size_t new_size;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  SafeInt<int> a;
  AssertionFailure *in_stack_ffffffffffffff00;
  unsigned_long in_stack_ffffffffffffff28;
  SafeInt<int> *in_stack_ffffffffffffff30;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> local_a8 [5];
  int local_2c;
  size_type local_28;
  
  if (in_ESI < 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    __cxa_throw(uVar2,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  __x = (value_type *)(in_RDI + 0x2b0);
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::size
            ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)__x);
  a.value_ = (int)in_stack_ffffffffffffff00;
  SafeInt<int>::SafeInt<unsigned_long>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_2c = (int)operator+(a,in_stack_fffffffffffffefc);
  iVar1 = mp::val((SafeInt<int>)local_2c);
  __new_size = (size_type)iVar1;
  this_00 = local_a8;
  local_28 = __new_size;
  LinearExpr::LinearExpr((LinearExpr *)0x13311d);
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::resize
            ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)this_00,__new_size,__x);
  LinearExpr::~LinearExpr((LinearExpr *)0x13313d);
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x133164);
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::resize((vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
            *)this_00,__new_size,(value_type *)__x);
  CommonExprPosDflt();
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,(value_type_conflict2 *)__x);
  return;
}

Assistant:

void AddCommonExprs(int num_exprs) {
    MP_ASSERT(num_exprs >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(linear_exprs_.size()) + num_exprs);
    linear_exprs_.resize(new_size, LinearExpr());
    nonlinear_exprs_.resize(new_size, NumericExpr());
    common_expr_positions_.resize(new_size, CommonExprPosDflt());
  }